

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_process_cep(acmod_t *acmod,mfcc_t ***inout_cep,int *inout_n_frames,int full_utt)

{
  int local_40;
  int local_3c;
  int32 ncep1;
  int orig_n_frames;
  int32 inptr;
  int32 ncep;
  int32 nfeat;
  int full_utt_local;
  int *inout_n_frames_local;
  mfcc_t ***inout_cep_local;
  acmod_t *acmod_local;
  
  ncep = full_utt;
  _nfeat = inout_n_frames;
  inout_n_frames_local = (int *)inout_cep;
  inout_cep_local = (mfcc_t ***)acmod;
  if (full_utt == 0) {
    if (acmod->mfcfh != (FILE *)0x0) {
      acmod_log_mfc(acmod,*inout_cep,*inout_n_frames);
    }
    local_3c = *_nfeat;
    if (*(char *)(inout_cep_local + 0x15) == '\x03') {
      inptr = *(int *)(inout_cep_local[4] + 4) + local_3c;
    }
    else {
      inptr = local_3c;
      if (*(char *)(inout_cep_local + 0x15) == '\x01') {
        inptr = local_3c - *(int *)(inout_cep_local[4] + 4);
      }
    }
    orig_n_frames = local_3c;
    if (*(int *)((long)inout_cep_local + 0xbc) - *(int *)(inout_cep_local + 0x18) < inptr) {
      if ((*(char *)((long)inout_cep_local + 0xaa) == '\0') &&
         (*(char *)(inout_cep_local + 0x15) != '\x03')) {
        orig_n_frames =
             local_3c -
             (inptr - (*(int *)((long)inout_cep_local + 0xbc) - *(int *)(inout_cep_local + 0x18)));
      }
      else {
        acmod_grow_feat_buf((acmod_t *)inout_cep_local,
                            *(int *)((long)inout_cep_local + 0xbc) + inptr);
      }
    }
    if (*(char *)((long)inout_cep_local + 0xaa) == '\0') {
      ncep1 = (*(int *)((long)inout_cep_local + 0xc4) + *(int *)(inout_cep_local + 0x18)) %
              *(int *)((long)inout_cep_local + 0xbc);
    }
    else {
      ncep1 = *(int *)((long)inout_cep_local + 0xc4) + *(int *)(inout_cep_local + 0x18);
      while (*(int *)((long)inout_cep_local + 0xbc) <= ncep1 + inptr) {
        acmod_grow_feat_buf((acmod_t *)inout_cep_local,*(int *)((long)inout_cep_local + 0xbc) << 1);
      }
    }
    if ((*(int *)((long)inout_cep_local + 0xbc) < ncep1 + inptr) &&
       (*(char *)(inout_cep_local + 0x15) == '\x03')) {
      *_nfeat = *_nfeat - orig_n_frames;
      *(long *)inout_n_frames_local = *(long *)inout_n_frames_local + (long)orig_n_frames * 8;
      acmod_local._4_4_ = 0;
    }
    else {
      if (*(int *)((long)inout_cep_local + 0xbc) < ncep1 + inptr) {
        local_40 = *(int *)((long)inout_cep_local + 0xbc) - ncep1;
        inptr = feat_s2mfc2feat_live
                          ((feat_t *)inout_cep_local[4],*(mfcc_t ***)inout_n_frames_local,&local_40,
                           (uint)(*(char *)(inout_cep_local + 0x15) == '\x01'),0,
                           (mfcc_t ***)(inout_cep_local[0xf] + ncep1));
        if (inptr < 0) {
          return -1;
        }
        *(int32 *)(inout_cep_local + 0x18) = inptr + *(int *)(inout_cep_local + 0x18);
        if (*(int *)((long)inout_cep_local + 0xbc) < *(int *)(inout_cep_local + 0x18)) {
          __assert_fail("acmod->n_feat_frame <= acmod->n_feat_alloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                        ,0x2e3,"int acmod_process_cep(acmod_t *, mfcc_t ***, int *, int)");
        }
        ncep1 = (inptr + ncep1) % *(int *)((long)inout_cep_local + 0xbc);
        *_nfeat = *_nfeat - local_40;
        *(long *)inout_n_frames_local = *(long *)inout_n_frames_local + (long)local_40 * 8;
        orig_n_frames = orig_n_frames - local_40;
      }
      inptr = feat_s2mfc2feat_live
                        ((feat_t *)inout_cep_local[4],*(mfcc_t ***)inout_n_frames_local,
                         &orig_n_frames,(uint)(*(char *)(inout_cep_local + 0x15) == '\x01'),
                         (uint)(*(char *)(inout_cep_local + 0x15) == '\x03'),
                         (mfcc_t ***)(inout_cep_local[0xf] + ncep1));
      if (inptr < 0) {
        acmod_local._4_4_ = -1;
      }
      else {
        *(int32 *)(inout_cep_local + 0x18) = inptr + *(int *)(inout_cep_local + 0x18);
        if (*(int *)((long)inout_cep_local + 0xbc) < *(int *)(inout_cep_local + 0x18)) {
          __assert_fail("acmod->n_feat_frame <= acmod->n_feat_alloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                        ,0x2f4,"int acmod_process_cep(acmod_t *, mfcc_t ***, int *, int)");
        }
        *_nfeat = *_nfeat - orig_n_frames;
        *(long *)inout_n_frames_local = *(long *)inout_n_frames_local + (long)orig_n_frames * 8;
        if (*(char *)(inout_cep_local + 0x15) == '\x01') {
          *(undefined1 *)(inout_cep_local + 0x15) = 2;
        }
        acmod_local._4_4_ = local_3c - *_nfeat;
      }
    }
  }
  else {
    acmod_local._4_4_ = acmod_process_full_cep(acmod,inout_cep,inout_n_frames);
  }
  return acmod_local._4_4_;
}

Assistant:

int
acmod_process_cep(acmod_t *acmod,
                  mfcc_t ***inout_cep,
                  int *inout_n_frames,
                  int full_utt)
{
    int32 nfeat, ncep, inptr;
    int orig_n_frames;

    /* If this is a full utterance, process it all at once. */
    if (full_utt)
        return acmod_process_full_cep(acmod, inout_cep, inout_n_frames);

    /* Write to log file. */
    if (acmod->mfcfh)
        acmod_log_mfc(acmod, *inout_cep, *inout_n_frames);

    /* Maximum number of frames we're going to generate. */
    orig_n_frames = ncep = nfeat = *inout_n_frames;

    /* FIXME: This behaviour isn't guaranteed... */
    if (acmod->state == ACMOD_ENDED)
        nfeat += feat_window_size(acmod->fcb);
    else if (acmod->state == ACMOD_STARTED)
        nfeat -= feat_window_size(acmod->fcb);

    /* Clamp number of features to fit available space. */
    if (nfeat > acmod->n_feat_alloc - acmod->n_feat_frame) {
        /* Grow it as needed - we have to grow it at the end of an
         * utterance because we can't return a short read there. */
        if (acmod->grow_feat || acmod->state == ACMOD_ENDED)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc + nfeat);
        else
            ncep -= (nfeat - (acmod->n_feat_alloc - acmod->n_feat_frame));
    }

    /* Where to start writing in the feature buffer. */
    if (acmod->grow_feat) {
        /* Grow to avoid wraparound if grow_feat == TRUE. */
        inptr = acmod->feat_outidx + acmod->n_feat_frame;
        while (inptr + nfeat >= acmod->n_feat_alloc)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
    }
    else {
        inptr = (acmod->feat_outidx + acmod->n_feat_frame) % acmod->n_feat_alloc;
    }


    /* FIXME: we can't split the last frame drop properly to be on the boundary, so just return */
    if (inptr + nfeat > acmod->n_feat_alloc && acmod->state == ACMOD_ENDED) {
	*inout_n_frames -= ncep;
	*inout_cep += ncep;
	return 0;
    }

    /* Write them in two parts if there is wraparound. */
    if (inptr + nfeat > acmod->n_feat_alloc) {
        int32 ncep1 = acmod->n_feat_alloc - inptr;

        /* Make sure we don't end the utterance here. */
        nfeat = feat_s2mfc2feat_live(acmod->fcb, *inout_cep,
                                     &ncep1,
                                     (acmod->state == ACMOD_STARTED),
                                     FALSE,
                                     acmod->feat_buf + inptr);
        if (nfeat < 0)
            return -1;
        /* Move the output feature pointer forward. */
        acmod->n_feat_frame += nfeat;
        assert(acmod->n_feat_frame <= acmod->n_feat_alloc);
        inptr += nfeat;
        inptr %= acmod->n_feat_alloc;
        /* Move the input feature pointers forward. */
        *inout_n_frames -= ncep1;
        *inout_cep += ncep1;
        ncep -= ncep1;
    }

    nfeat = feat_s2mfc2feat_live(acmod->fcb, *inout_cep,
                                 &ncep,
                                 (acmod->state == ACMOD_STARTED),
                                 (acmod->state == ACMOD_ENDED),
                                 acmod->feat_buf + inptr);
    if (nfeat < 0)
        return -1;
    acmod->n_feat_frame += nfeat;
    assert(acmod->n_feat_frame <= acmod->n_feat_alloc);
    /* Move the input feature pointers forward. */
    *inout_n_frames -= ncep;
    *inout_cep += ncep;
    if (acmod->state == ACMOD_STARTED)
        acmod->state = ACMOD_PROCESSING;
    return orig_n_frames - *inout_n_frames;
}